

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

Maybe<kj::Array<unsigned_char>_> * __thiscall
kj::Exception::releaseDetail
          (Maybe<kj::Array<unsigned_char>_> *__return_storage_ptr__,Exception *this,
          DetailTypeId typeId)

{
  Detail *pDVar1;
  uchar *puVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  RemoveConst<kj::Exception::Detail> *pRVar5;
  ArrayDisposer *pAVar6;
  size_t sVar7;
  Detail *pDVar8;
  
  pDVar8 = (this->details).builder.ptr;
  pDVar1 = (this->details).builder.pos;
  if (pDVar8 != pDVar1) {
    do {
      if (pDVar8->id == typeId) {
        puVar2 = (pDVar8->value).ptr;
        sVar3 = (pDVar8->value).size_;
        pAVar4 = (pDVar8->value).disposer;
        (pDVar8->value).ptr = (uchar *)0x0;
        (pDVar8->value).size_ = 0;
        pRVar5 = (this->details).builder.pos;
        if (pDVar8 != pRVar5 + -1) {
          pDVar8->id = pRVar5[-1].id;
          pAVar6 = pRVar5[-1].value.disposer;
          sVar7 = pRVar5[-1].value.size_;
          (pDVar8->value).ptr = pRVar5[-1].value.ptr;
          (pDVar8->value).size_ = sVar7;
          (pDVar8->value).disposer = pAVar6;
          pRVar5[-1].value.ptr = (uchar *)0x0;
          pRVar5[-1].value.size_ = 0;
        }
        ArrayBuilder<kj::Exception::Detail>::removeLast(&(this->details).builder);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.ptr = puVar2;
        (__return_storage_ptr__->ptr).field_1.value.size_ = sVar3;
        (__return_storage_ptr__->ptr).field_1.value.disposer = pAVar4;
        return __return_storage_ptr__;
      }
      pDVar8 = pDVar8 + 1;
    } while (pDVar8 != pDVar1);
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<byte>> Exception::releaseDetail(DetailTypeId typeId) {
  for (auto& detail: details) {
    if (detail.id == typeId) {
      kj::Array<byte> result = kj::mv(detail.value);
      if (&detail != &details.back()) {
        detail = kj::mv(details.back());
      }
      details.removeLast();
      return kj::mv(result);
    }
  }
  return kj::none;
}